

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O3

Aig_Man_t * Fra_FraigEquivence(Aig_Man_t *pManAig,int nConfMax,int fProve)

{
  Aig_Man_t *pAVar1;
  Fra_Par_t *pPars;
  Fra_Par_t Pars;
  Fra_Par_t FStack_98;
  
  Fra_ParamsDefault(&FStack_98);
  FStack_98.fChoicing = 0;
  FStack_98.fSpeculate = 0;
  FStack_98.fVerbose = 0;
  FStack_98.fDoSparse = 1;
  FStack_98.fDontShowBar = 1;
  FStack_98.fProve = fProve;
  FStack_98.nBTLimitNode = nConfMax;
  pAVar1 = Fra_FraigPerform(pManAig,&FStack_98);
  return pAVar1;
}

Assistant:

Aig_Man_t * Fra_FraigEquivence( Aig_Man_t * pManAig, int nConfMax, int fProve )
{
    Aig_Man_t * pFraig;
    Fra_Par_t Pars, * pPars = &Pars; 
    Fra_ParamsDefault( pPars );
    pPars->nBTLimitNode = nConfMax;
    pPars->fChoicing    = 0;
    pPars->fDoSparse    = 1;
    pPars->fSpeculate   = 0;
    pPars->fProve       = fProve;
    pPars->fVerbose     = 0;
    pPars->fDontShowBar = 1;
    pFraig = Fra_FraigPerform( pManAig, pPars );
    return pFraig;
}